

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueFloatCase::test(UniformValueFloatCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  GLint GVar1;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  ShaderProgram program;
  ProgramSources local_e8;
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,
             "uniform highp float floatUniform;\nuniform highp vec2 float2Uniform;\nuniform highp vec3 float3Uniform;\nuniform highp vec4 float4Uniform;\nvoid main (void)\n{\n\tgl_Position = vec4(floatUniform + float2Uniform.x + float3Uniform.x + float4Uniform.x);\n}\n"
             ,&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n",&local_1fa
            );
  glu::makeVtxFragSources(&local_e8,&local_1d8,&local_1f8);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (program.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&program);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,program.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"floatUniform");
    glu::CallLogWrapper::glUniform1f(this_00,GVar1,1.0);
    verifyUniformValue1f
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,1.0);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"float2Uniform");
    glu::CallLogWrapper::glUniform2f(this_00,GVar1,1.0,2.0);
    verifyUniformValue2f
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,1.0,2.0);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"float3Uniform");
    glu::CallLogWrapper::glUniform3f(this_00,GVar1,1.0,2.0,3.0);
    verifyUniformValue3f
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,1.0,2.0,3.0);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"float4Uniform");
    glu::CallLogWrapper::glUniform4f(this_00,GVar1,1.0,2.0,3.0,4.0);
    verifyUniformValue4f
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,1.0,2.0,3.0,4.0);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp float floatUniform;\n"
			"uniform highp vec2 float2Uniform;\n"
			"uniform highp vec3 float3Uniform;\n"
			"uniform highp vec4 float4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(floatUniform + float2Uniform.x + float3Uniform.x + float4Uniform.x);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program.getProgram(), "floatUniform");
		glUniform1f(location, 1.0f);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), location, 1.0f);

		location = glGetUniformLocation(program.getProgram(), "float2Uniform");
		glUniform2f(location, 1.0f, 2.0f);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), location, 1.0f, 2.0f);

		location = glGetUniformLocation(program.getProgram(), "float3Uniform");
		glUniform3f(location, 1.0f, 2.0f, 3.0f);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), location, 1.0f, 2.0f, 3.0f);

		location = glGetUniformLocation(program.getProgram(), "float4Uniform");
		glUniform4f(location, 1.0f, 2.0f, 3.0f, 4.0f);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), location, 1.0f, 2.0f, 3.0f, 4.0f);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}